

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* unicode_regex_split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *__return_storage_ptr__,string *text,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *regex_exprs)

{
  pointer psVar1;
  char cVar2;
  pointer pbVar3;
  pointer pcVar4;
  unsigned_long uVar5;
  char *pcVar6;
  unsigned_long *puVar7;
  pointer puVar8;
  pointer puVar9;
  undefined8 uVar10;
  wchar_t *pwVar11;
  unsigned_long *puVar12;
  wchar_t *pwVar13;
  byte bVar14;
  bool bVar15;
  unicode_cpt_flags uVar16;
  unicode_cpt_flags uVar17;
  int iVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  long lVar21;
  _Base_ptr p_Var22;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar23;
  wchar_t *pwVar24;
  const_iterator cVar25;
  mapped_type_conflict1 *pmVar26;
  mapped_type *pmVar27;
  pointer psVar28;
  ulong uVar29;
  runtime_error *this;
  uint uVar30;
  _Base_ptr p_Var31;
  long lVar32;
  uint32_t uVar33;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  _Alloc_hider _Var37;
  ulong uVar38;
  pointer puVar39;
  long lVar40;
  pointer psVar41;
  size_t offset_ini_1;
  ulong uVar42;
  pointer pbVar43;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex_expr;
  ulong uVar44;
  char *pcVar45;
  size_t offset_ini;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar46;
  long *plVar47;
  initializer_list<unsigned_long> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l_00;
  initializer_list<std::pair<const_int,_int>_> __l_01;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bpe_offsets;
  size_t len;
  wcmatch match;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpe_words;
  wstring wtext;
  string text_collapsed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts_1;
  uint8_t in_stack_fffffffffffffd7f;
  undefined1 local_278 [32];
  pointer local_258;
  pointer psStack_250;
  pointer local_248;
  wchar_t *pwStack_240;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  regex_type local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  pointer local_1d8;
  vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  local_1d0;
  size_type local_1b8;
  wchar_t *local_1b0;
  wide_string local_1a8;
  wchar_t *local_188;
  wchar_t *local_180;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_178;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_158;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_150;
  undefined8 local_148;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> local_140;
  undefined7 uStack_13f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  undefined1 local_118 [24];
  undefined1 auStack_100 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_78;
  string *local_48;
  unsigned_long *local_40;
  pointer local_38;
  
  local_158 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_48 = text;
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_enum_abi_cxx11_ == '\0') &&
     (iVar18 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_enum_abi_cxx11_), iVar18 != 0)) {
    local_278._0_4_ = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)local_118,(char (*) [6])"\\p{N}",(anon_enum_32 *)local_278);
    local_218._M_flags = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_f0,(char (*) [6])"\\p{L}",&local_218._M_flags);
    local_1d0.
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_1d0.
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_c8,(char (*) [6])"\\p{P}",(anon_enum_32 *)&local_1d0);
    local_150 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_150._4_4_,0x10);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_a0,(char (*) [6])"\\p{M}",(anon_enum_32 *)&local_150);
    local_1a8._M_dataplus._M_p._0_4_ = 0x40;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<const_char_(&)[6],_unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_true>
              (&local_78,(char (*) [6])"\\p{S}",(anon_enum_32 *)&local_1a8);
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)local_118;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::map(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_enum_abi_cxx11_,__l_00,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_178,(allocator_type *)&local_130);
    lVar21 = -200;
    paVar46 = &local_78.first.field_2;
    do {
      if (paVar46 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar46->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar46->_M_allocated_capacity)[-2],
                        paVar46->_M_allocated_capacity + 1);
      }
      paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar46->_M_allocated_capacity + -5);
      lVar21 = lVar21 + 0x28;
    } while (lVar21 != 0);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_cpt == '\0') &&
     (iVar18 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_cpt), iVar18 != 0)) {
    local_118._16_8_ = (regex_type *)0xd300000020;
    auStack_100._0_8_ = 0xd400000010;
    local_118._0_4_ = 2;
    local_118._4_4_ = 0xd1;
    local_118._8_8_ = (pointer)0xd200000004;
    auStack_100._8_8_ = (void *)0xd500000040;
    __l_01._M_len = 5;
    __l_01._M_array = (iterator)local_118;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (&unicode_regex_split::k_ucat_cpt,__l_01,(less<int> *)local_278,
               (allocator_type *)&local_218);
    __cxa_atexit(std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 ~map,&unicode_regex_split::k_ucat_cpt,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_cpt);
  }
  if ((unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::k_ucat_map_abi_cxx11_ == '\0') &&
     (iVar18 = __cxa_guard_acquire(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                    ::k_ucat_map_abi_cxx11_), iVar18 != 0)) {
    local_278._0_4_ = 2;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[4],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118,(anon_enum_32 *)local_278,(char (*) [4])"0-9");
    local_218._M_flags = 4;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[7],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_f0,&local_218._M_flags,(char (*) [7])"A-Za-z");
    local_1d0.
    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_1d0.
                           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[26],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_c8,(anon_enum_32 *)&local_1d0,
               (char (*) [26])"!-#%-*,-/:-;?-@\\[-\\]_\\{\\}");
    local_150 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                CONCAT44(local_150._4_4_,0x10);
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[1],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0,(anon_enum_32 *)&local_150,(char (*) [1])0x23d339);
    local_1a8._M_dataplus._M_p._0_4_ = 0x40;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<unicode_cpt_flags::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_src_unicode_h:8:5),_const_char_(&)[12],_true>
              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_78,(anon_enum_32 *)&local_1a8,(char (*) [12])"\\$\\+<->^`\\|");
    __l_02._M_len = 5;
    __l_02._M_array = (iterator)local_118;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::k_ucat_map_abi_cxx11_,__l_02,(less<int> *)&local_178,(allocator_type *)&local_130);
    lVar21 = -200;
    plVar47 = (long *)((long)&local_78.first.field_2 + 8);
    do {
      if (plVar47 != (long *)plVar47[-2]) {
        operator_delete((long *)plVar47[-2],*plVar47 + 1);
      }
      plVar47 = plVar47 + -5;
      lVar21 = lVar21 + 0x28;
    } while (lVar21 != 0);
    __cxa_atexit(std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_map_abi_cxx11_);
  }
  pbVar3 = (regex_exprs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar15 = false;
  p_Var22 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
            ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pbVar43 = (regex_exprs->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var22,
      pbVar43 != pbVar3; pbVar43 = pbVar43 + 1) {
    if ((_Rb_tree_header *)p_Var22 !=
        &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
         ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      do {
        lVar21 = std::__cxx11::string::find((char *)pbVar43,*(ulong *)(p_Var22 + 1),0);
        if (lVar21 != -1) {
          bVar15 = true;
          break;
        }
        p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
      } while ((_Rb_tree_header *)p_Var22 !=
               &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
    }
    p_Var22 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  unicode_cpts_from_utf8(&local_130,local_48);
  local_150 = &local_140;
  local_148 = 0;
  local_140 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0x0;
  puVar39 = local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((bVar15) &&
     (std::__cxx11::string::resize
                ((ulong)&local_150,
                 (char)((long)local_130.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_130.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2)),
     puVar39 = local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish !=
     local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start)) {
    uVar42 = 0;
    do {
      uVar30 = local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar42];
      if (uVar30 < 0x80) {
        local_150[uVar42] = SUB41(uVar30,0);
      }
      else {
        uVar17 = unicode_cpt_flags_from_cpt(uVar30);
        if (((ushort)uVar17 >> 8 & 1) == 0) {
          if (unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
              != (_Base_ptr)0x0) {
            bVar14 = uVar17._0_1_;
            p_Var31 = &unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var22 = unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
            do {
              if ((int)(uint)bVar14 <= (int)p_Var22[1]._M_color) {
                p_Var31 = p_Var22;
              }
              p_Var22 = (&p_Var22->_M_left)[(int)p_Var22[1]._M_color < (int)(uint)bVar14];
            } while (p_Var22 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var31 !=
                 &unicode_regex_split::k_ucat_cpt._M_t._M_impl.super__Rb_tree_header) &&
               ((int)p_Var31[1]._M_color <= (int)CONCAT31(0,bVar14))) {
              local_118._0_4_ = CONCAT31(0,bVar14);
              pvVar23 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        at(&unicode_regex_split::k_ucat_cpt,(key_type *)local_118);
              local_150[uVar42] = *pvVar23;
              goto LAB_00220797;
            }
          }
          local_150[uVar42] =
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0xd0;
        }
        else {
          local_150[uVar42] = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)0xb
          ;
        }
      }
LAB_00220797:
      uVar42 = uVar42 + 1;
      puVar39 = local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar42 < (ulong)((long)local_130.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_130.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_118._0_8_ =
       (long)local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar39 >> 2;
  __l._M_len = 1;
  __l._M_array = (iterator)local_118;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1f8,__l,(allocator_type *)local_278);
  pbVar43 = (regex_exprs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (regex_exprs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar43 != local_38) {
    do {
      iVar18 = std::__cxx11::string::compare((char *)pbVar43);
      local_1d8 = pbVar43;
      if (iVar18 == 0) {
        local_278._0_8_ = (wchar_t *)0x0;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0;
        local_278._16_4_ = 0;
        local_278._20_4_ = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        unicode_cpts_from_utf8
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,local_48);
        local_1b0 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pwVar24 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar42 = 0;
LAB_00220f2d:
          uVar38 = uVar42 + *(unsigned_long *)pwVar24;
          local_188 = pwVar24;
          uVar36 = uVar42;
          uVar29 = uVar42;
joined_r0x00220f44:
          if (uVar38 <= uVar29) goto LAB_00221330;
          if (uVar29 < uVar42) {
LAB_00220f4f:
            uVar29 = uVar29 + 1;
            local_218._0_8_ = uVar29 - uVar36;
            uVar36 = uVar29;
            if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
              if ((unsigned_long *)local_278._8_8_ ==
                  (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                           (iterator)local_278._8_8_,(unsigned_long *)&local_218);
              }
              else {
                *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                local_278._8_8_ = local_278._8_8_ + 8;
              }
            }
            goto joined_r0x00220f44;
          }
          uVar33 = *(uint32_t *)(local_118._0_8_ + uVar29 * 4);
          uVar17 = unicode_cpt_flags_from_cpt(uVar33);
          if (uVar33 == 0x20) {
            if (uVar29 + 1 < uVar38) {
              uVar17 = unicode_cpt_flags_from_cpt(((pointer)(local_118._0_8_ + 4))[uVar29]);
              lVar21 = 1;
              goto LAB_002210a7;
            }
LAB_002210cd:
            uVar35 = 0;
            do {
              uVar34 = uVar29 + uVar35;
              if (uVar38 <= uVar34) {
LAB_002212ad:
                if (uVar35 == 0) goto LAB_00220f4f;
                goto LAB_002212bb;
              }
              uVar17 = unicode_cpt_flags_from_cpt(((pointer)(local_118._0_8_ + uVar29 * 4))[uVar35])
              ;
              if (((ushort)uVar17 >> 8 & 1) == 0) {
                if (uVar35 < 2) goto LAB_002212ad;
                if (((pointer)(uVar29 * 4 + local_118._0_8_))[uVar35] == 0xffffffff)
                goto LAB_002212bb;
                local_218._0_8_ = uVar29 + ~uVar36 + uVar35;
                if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                  if ((unsigned_long *)local_278._8_8_ ==
                      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                               (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                  }
                  else {
                    *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                    local_278._8_8_ = local_278._8_8_ + 8;
                  }
                }
                uVar36 = uVar29 + (uVar35 - 1);
                uVar29 = uVar36;
                goto joined_r0x00220f44;
              }
              lVar21 = uVar35 + 1;
              uVar35 = uVar35 + 1;
            } while (uVar42 <= uVar29 + lVar21);
            if (uVar35 == 0) goto LAB_00220f4f;
            uVar34 = uVar29 + uVar35;
LAB_002212bb:
            local_218._0_8_ = uVar34 - uVar36;
            uVar36 = uVar34;
            uVar29 = uVar34;
            if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
              if ((unsigned_long *)local_278._8_8_ !=
                  (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) goto LAB_002212d4;
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                         (iterator)local_278._8_8_,(unsigned_long *)&local_218);
            }
            goto joined_r0x00220f44;
          }
          if ((uVar33 == 0x27) && (uVar29 + 1 < uVar38)) {
            uVar30 = ((pointer)(local_118._0_8_ + 4))[uVar29];
            if ((uVar30 - 100 < 0x11) && ((0x18201U >> (uVar30 - 100 & 0x1f) & 1) != 0)) {
              uVar35 = uVar29 + 2;
              local_218._0_8_ = uVar35 - uVar36;
              if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                if ((unsigned_long *)local_278._8_8_ ==
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                             (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                }
                else {
LAB_00220ff4:
                  *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                  local_278._8_8_ = local_278._8_8_ + 8;
                }
              }
            }
            else {
              if (uVar38 <= uVar29 + 2) goto LAB_002210a5;
              if (((uVar30 & 0xfffffffb) != 0x72) ||
                 (((pointer)(local_118._0_8_ + 8))[uVar29] != 0x65)) {
                if (uVar30 != 0x6c) goto LAB_002210a5;
                lVar21 = 0;
                if (((pointer)(local_118._0_8_ + 8))[uVar29] != 0x6c) goto LAB_002210a7;
              }
              uVar35 = uVar29 + 3;
              local_218._0_8_ = uVar35 - uVar36;
              if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                if ((unsigned_long *)local_278._8_8_ !=
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) goto LAB_00220ff4;
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                           (iterator)local_278._8_8_,(unsigned_long *)&local_218);
              }
            }
            uVar36 = uVar35;
            uVar29 = uVar29 + local_218._0_8_;
            goto joined_r0x00220f44;
          }
LAB_002210a5:
          lVar21 = 0;
LAB_002210a7:
          if (((ushort)uVar17 & 4) != 0) goto LAB_00221130;
          if (((ushort)uVar17 & 2) == 0) {
            if (uVar17 == (unicode_cpt_flags)0x0 || ((ushort)uVar17 & 0x100) != 0)
            goto LAB_002210cd;
            uVar29 = uVar29 + lVar21 + 1;
            uVar35 = uVar29;
            while ((uVar34 = uVar35, uVar42 <= uVar29 && (uVar34 < uVar38))) {
              uVar17 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_118._0_8_ + uVar34 * 4));
              if ((uVar17 == (unicode_cpt_flags)0x0) ||
                 (uVar35 = uVar34 + 1, ((ushort)uVar17 & 0x106) != 0)) break;
            }
            local_218._0_8_ = uVar34 - uVar36;
            uVar36 = uVar34;
            uVar29 = uVar34;
            if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
              if ((unsigned_long *)local_278._8_8_ !=
                  (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) goto LAB_002212d4;
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                         (iterator)local_278._8_8_,(unsigned_long *)&local_218);
            }
            goto joined_r0x00220f44;
          }
          uVar29 = uVar29 + lVar21 + 1;
          uVar35 = uVar29;
          do {
            uVar34 = uVar35;
            if ((uVar29 < uVar42) || (uVar38 <= uVar34)) break;
            uVar17 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_118._0_8_ + uVar34 * 4));
            uVar35 = uVar34 + 1;
          } while (((ushort)uVar17 & 2) != 0);
          local_218._0_8_ = uVar34 - uVar36;
          uVar36 = uVar34;
          uVar29 = uVar34;
          if ((undefined1 *)local_218._0_8_ == (undefined1 *)0x0) goto joined_r0x00220f44;
          if ((unsigned_long *)local_278._8_8_ ==
              (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                       (iterator)local_278._8_8_,(unsigned_long *)&local_218);
            goto joined_r0x00220f44;
          }
          goto LAB_002212d4;
        }
      }
      else {
        iVar18 = std::__cxx11::string::compare((char *)pbVar43);
        if (iVar18 != 0) {
          iVar18 = std::__cxx11::string::compare((char *)pbVar43);
          if (iVar18 != 0) {
            local_1b0 = (wchar_t *)0x0;
            local_40 = (unsigned_long *)0x0;
            goto LAB_002213da;
          }
        }
        local_278._0_8_ = (wchar_t *)0x0;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0;
        local_278._16_4_ = 0;
        local_278._20_4_ = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        unicode_cpts_from_utf8
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,local_48);
        local_1b0 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pwVar24 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar42 = 0;
LAB_002208f2:
          uVar38 = uVar42 + *(unsigned_long *)pwVar24;
          local_188 = pwVar24;
          uVar36 = uVar42;
          uVar29 = uVar42;
joined_r0x00220909:
          if (uVar38 <= uVar29) goto LAB_00220ea8;
          if (uVar29 < uVar42) {
            uVar33 = 0xffffffff;
            uVar17 = (unicode_cpt_flags)0x0;
LAB_00220921:
            if ((uVar29 + 1 < uVar42) || (uVar38 <= uVar29 + 1)) goto LAB_00220ad2;
            uVar16 = unicode_cpt_flags_from_cpt(((pointer)(local_118._0_8_ + 4))[uVar29]);
            if (((ushort)uVar16 & 4) == 0) goto LAB_00220ad2;
LAB_00220a73:
            uVar35 = uVar29 + 1;
            do {
              uVar34 = uVar35;
              if ((uVar29 + 1 < uVar42) || (uVar38 <= uVar34)) break;
              uVar17 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_118._0_8_ + uVar34 * 4));
              uVar35 = uVar34 + 1;
            } while (((ushort)uVar17 & 4) != 0);
            local_218._0_8_ = uVar34 - uVar36;
            uVar36 = uVar34;
            uVar29 = uVar34;
            if ((undefined1 *)local_218._0_8_ == (undefined1 *)0x0) goto joined_r0x00220909;
            if ((unsigned_long *)local_278._8_8_ ==
                (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                         (iterator)local_278._8_8_,(unsigned_long *)&local_218);
              goto joined_r0x00220909;
            }
          }
          else {
            uVar33 = *(uint32_t *)(local_118._0_8_ + uVar29 * 4);
            uVar17 = unicode_cpt_flags_from_cpt(uVar33);
            uVar10 = local_118._0_8_;
            if ((uVar33 != 10) && (uVar33 != 0xd)) {
              if ((uVar33 == 0x27) && (uVar29 + 1 < uVar38)) {
                uVar19 = unicode_tolower(((pointer)(local_118._0_8_ + 4))[uVar29]);
                if ((uVar19 - 100 < 0x11) && ((0x18201U >> (uVar19 - 100 & 0x1f) & 1) != 0)) {
                  uVar35 = uVar29 + 2;
                  local_218._0_8_ = uVar35 - uVar36;
                  if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                    if ((unsigned_long *)local_278._8_8_ ==
                        (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                    }
                    else {
LAB_002209e2:
                      *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                      local_278._8_8_ = local_278._8_8_ + 8;
                    }
                  }
LAB_00220e04:
                  uVar36 = uVar35;
                  uVar29 = uVar29 + local_218._0_8_;
                  goto joined_r0x00220909;
                }
                if (uVar29 + 2 < uVar38) {
                  uVar20 = unicode_tolower(((pointer)(uVar10 + 8))[uVar29]);
                  if ((((uVar19 & 0xfffffffb) == 0x72) && (uVar20 == 0x65)) ||
                     ((uVar19 == 0x6c && (uVar20 == 0x6c)))) {
                    uVar35 = uVar29 + 3;
                    local_218._0_8_ = uVar35 - uVar36;
                    if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                      if ((unsigned_long *)local_278._8_8_ !=
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_))
                      goto LAB_002209e2;
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                    }
                    goto LAB_00220e04;
                  }
                }
              }
              if (((ushort)uVar17 & 2) == 0) {
                if (((ushort)uVar17 & 4) == 0) goto LAB_00220921;
                goto LAB_00220a73;
              }
            }
LAB_00220ad2:
            if (((ushort)uVar17 & 2) != 0) {
              uVar34 = uVar29;
              if (uVar42 <= uVar29) {
                while (uVar34 < uVar38) {
                  uVar35 = uVar34 + 1;
                  uVar17 = unicode_cpt_flags_from_cpt(((pointer)(local_118._0_8_ + -4))[uVar35]);
                  if (((ushort)uVar17 & 2) == 0) break;
                  uVar34 = uVar35;
                  if ((2 < uVar35 - uVar29) &&
                     (local_218._0_8_ = uVar35 - uVar36, uVar36 = uVar35, uVar29 = uVar35,
                     (undefined1 *)local_218._0_8_ != (undefined1 *)0x0)) {
                    if ((unsigned_long *)local_278._8_8_ ==
                        (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                      std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                 (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                    }
                    else {
                      *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                      local_278._8_8_ = local_278._8_8_ + 8;
                    }
                  }
                }
              }
              local_218._0_8_ = uVar34 - uVar36;
              uVar36 = uVar34;
              uVar29 = uVar34;
              if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                if ((unsigned_long *)local_278._8_8_ !=
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) goto LAB_00220ca3;
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                           (iterator)local_278._8_8_,(unsigned_long *)&local_218);
              }
              goto joined_r0x00220909;
            }
            uVar16 = uVar17;
            if (uVar33 == 0x20) {
              uVar16 = (unicode_cpt_flags)0x0;
              if ((uVar42 <= uVar29 + 1) && (uVar29 + 1 < uVar38)) {
                uVar16 = unicode_cpt_flags_from_cpt(((pointer)(local_118._0_8_ + 4))[uVar29]);
              }
            }
            if ((uVar17 != (unicode_cpt_flags)0x0) && (((ushort)uVar16 & 0x106) == 0)) {
              if (uVar16 == (unicode_cpt_flags)0x0) {
                uVar35 = uVar29 + (uVar33 == 0x20);
              }
              else {
                uVar29 = uVar29 + (ulong)(uVar33 == 0x20) + 1;
                uVar34 = uVar29;
                while ((uVar35 = uVar34, uVar42 <= uVar29 && (uVar35 < uVar38))) {
                  uVar17 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_118._0_8_ + uVar35 * 4));
                  if ((uVar17 == (unicode_cpt_flags)0x0) ||
                     (uVar34 = uVar35 + 1, ((ushort)uVar17 & 0x106) != 0)) break;
                }
              }
              uVar30 = 0xffffffff;
              if ((uVar42 <= uVar35) && (uVar35 < uVar38)) goto LAB_00220e25;
              do {
                lVar21 = -uVar35;
                uVar29 = uVar35 + 1;
                do {
                  uVar35 = uVar29;
                  if ((uVar30 != 0xd) && (uVar30 != 10)) {
                    local_218._0_8_ = -lVar21 - uVar36;
                    if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                      if ((unsigned_long *)local_278._8_8_ ==
                          (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                        std::vector<unsigned_long,std::allocator<unsigned_long>>::
                        _M_realloc_insert<unsigned_long_const&>
                                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                                   (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                      }
                      else {
                        *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                        local_278._8_8_ = local_278._8_8_ + 8;
                      }
                    }
                    uVar36 = -lVar21;
                    uVar29 = -lVar21;
                    goto joined_r0x00220909;
                  }
                  lVar21 = lVar21 + -1;
                  uVar30 = 0xffffffff;
                  uVar29 = uVar35 + 1;
                } while ((uVar35 < uVar42) || (uVar38 <= uVar35));
                uVar35 = -lVar21;
LAB_00220e25:
                uVar30 = *(pointer)(local_118._0_8_ + uVar35 * 4);
              } while( true );
            }
            if ((uVar29 < uVar42) || (uVar38 <= uVar29)) {
LAB_00220db5:
              uVar29 = uVar29 + 1;
              local_218._0_8_ = uVar29 - uVar36;
              uVar36 = uVar29;
              if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                if ((unsigned_long *)local_278._8_8_ ==
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                             (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                }
                else {
                  *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                  local_278._8_8_ = local_278._8_8_ + 8;
                }
              }
              goto joined_r0x00220909;
            }
            uVar34 = 0;
            uVar35 = 0;
            do {
              uVar17 = unicode_cpt_flags_from_cpt(((pointer)(local_118._0_8_ + uVar29 * 4))[uVar35])
              ;
              if (((ushort)uVar17 >> 8 & 1) == 0) {
                uVar44 = uVar29 + uVar35;
                break;
              }
              uVar30 = ((pointer)(local_118._0_8_ + uVar29 * 4))[uVar35];
              if ((uVar30 == 0xd) || (uVar30 == 10)) {
                uVar34 = uVar29 + uVar35 + 1;
              }
              lVar21 = uVar35 + 1;
              uVar35 = uVar35 + 1;
              uVar44 = uVar38;
            } while (uVar29 + lVar21 < uVar38);
            if (uVar34 == 0) {
              if (uVar35 < 2) {
                if (uVar35 == 0) goto LAB_00220db5;
              }
              else if ((uVar44 < uVar38) && (*(pointer)(local_118._0_8_ + uVar44 * 4) != 0xffffffff)
                      ) {
                uVar34 = uVar29 + (uVar35 - 1);
                local_218._0_8_ = uVar34 - uVar36;
                uVar36 = uVar34;
                uVar29 = uVar34;
                if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                  if ((unsigned_long *)local_278._8_8_ !=
                      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_))
                  goto LAB_00220ca3;
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                             (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                }
                goto joined_r0x00220909;
              }
              local_218._0_8_ = uVar44 - uVar36;
              uVar36 = uVar44;
              uVar29 = uVar44;
              if ((undefined1 *)local_218._0_8_ != (undefined1 *)0x0) {
                if ((unsigned_long *)local_278._8_8_ ==
                    (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long_const&>
                            ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                             (iterator)local_278._8_8_,(unsigned_long *)&local_218);
                }
                else {
                  *(undefined8 *)local_278._8_8_ = local_218._0_8_;
                  local_278._8_8_ = local_278._8_8_ + 8;
                }
              }
              goto joined_r0x00220909;
            }
            local_218._0_8_ = uVar34 - uVar36;
            uVar36 = uVar34;
            uVar29 = uVar34;
            if ((undefined1 *)local_218._0_8_ == (undefined1 *)0x0) goto joined_r0x00220909;
            if ((unsigned_long *)local_278._8_8_ ==
                (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
                         (iterator)local_278._8_8_,(unsigned_long *)&local_218);
              goto joined_r0x00220909;
            }
          }
LAB_00220ca3:
          *(undefined8 *)local_278._8_8_ = local_218._0_8_;
          local_278._8_8_ = local_278._8_8_ + 8;
          uVar36 = uVar34;
          uVar29 = uVar34;
          goto joined_r0x00220909;
        }
      }
LAB_0022134d:
      if ((pair<const_int,_int>)local_118._0_8_ != (pair<const_int,_int>)0x0) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
      }
      pwVar11 = (wchar_t *)local_278._0_8_;
      puVar12 = (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_);
      pwVar24 = (wchar_t *)
                local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar7 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pbVar43 = local_1d8;
      pwVar13 = (wchar_t *)local_278._8_8_;
      if (local_278._0_8_ == local_278._8_8_) {
        local_1b0 = (wchar_t *)local_278._0_8_;
        local_40 = (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_);
LAB_002213da:
        p_Var22 = unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_002213e1:
        if ((_Rb_tree_header *)p_Var22 ==
            &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                             *)local_118);
          pcVar45 = (pbVar43->_M_dataplus)._M_p;
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::from_bytes(&local_1a8,
                       (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                        *)local_118,pcVar45,pcVar45 + pbVar43->_M_string_length);
          std::__cxx11::
          wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
          ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                              *)local_118);
          local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&local_178.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data + 0x10);
          std::__cxx11::wstring::
          _M_construct<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    ((wstring *)&local_178,
                     local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
          if (local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) {
            puVar39 = (pointer)0x0;
            do {
              if (L'\x7f' < (int)local_178.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)puVar39]) {
                uVar17 = unicode_cpt_flags_from_cpt
                                   (local_178.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[(long)puVar39]);
                if (((ushort)uVar17 >> 8 & 1) != 0) {
                  local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)puVar39] = L'\v';
                }
              }
              puVar39 = (pointer)((long)puVar39 + 1);
            } while (puVar39 < local_178.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          }
          std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
          basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
                    ((basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>> *)&local_218,
                     &local_1a8,0x10);
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    (&local_238,
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_188 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar21 = 0;
            pwVar24 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              uVar5 = *(unsigned_long *)pwVar24;
              std::__cxx11::
              regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
              regex_iterator((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                              *)local_118,
                             (wchar_t *)
                             (local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar21),
                             (wchar_t *)
                             (local_178.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar21 + uVar5),
                             (regex_type *)&local_218,0);
              local_248 = (pointer)0x0;
              pwStack_240 = (wchar_t *)0x0;
              local_258 = (pointer)0x0;
              psStack_250 = (pointer)0x0;
              local_278._16_4_ = 0;
              local_278._20_4_ = 0;
              local_278._24_4_ = 0;
              local_278._0_8_ = (wchar_t *)0x0;
              local_278._8_4_ = 0;
              local_278._12_4_ = 0;
              bVar15 = std::__cxx11::
                       regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                       ::operator==((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                     *)local_118,
                                    (regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                     *)local_278);
              lVar32 = 0;
              while (!bVar15) {
                std::
                vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                ::vector((vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          *)&local_1d0,
                         (vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                          *)(auStack_100 + 8));
                local_1b8 = local_f0.first.field_2._M_allocated_capacity;
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  lVar40 = (long)local_1d0.
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-3].
                                 super_pair<const_char_*,_const_char_*>.first -
                           local_f0.first.field_2._0_8_;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  lVar40 = (long)((local_1d0.
                                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_pair<const_char_*,_const_char_*>).first -
                           local_f0.first.field_2._0_8_;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                if (lVar32 < lVar40 >> 2) {
                  local_180 = (wchar_t *)((lVar40 >> 2) - lVar32);
                  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<long>
                              (&local_238,
                               (iterator)
                               local_238.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                    psVar28 = local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)local_180;
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                    psVar28 = local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                lVar32 = (long)psVar28 -
                         (long)local_1d0.
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                psVar1 = (pointer)((long)local_1d0.
                                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -0x48)
                ;
                psVar41 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == psVar28) {
                  psVar41 = psVar1;
                }
                if (lVar32 == 0x48) {
                  psVar41 = psVar1;
                }
                local_180 = (wchar_t *)
                            ((long)(psVar41->super_pair<const_char_*,_const_char_*>).second -
                             (long)(psVar41->super_pair<const_char_*,_const_char_*>).first >> 2);
                if (psVar41->matched == false) {
                  local_180 = (wchar_t *)0x0;
                }
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                  lVar32 = (long)local_1d0.
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1d0.
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)local_180;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == psVar28) {
                  pcVar45 = *(char **)((long)&local_1d0.
                                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-3].
                                              super_pair<const_char_*,_const_char_*>.first + lVar32)
                  ;
                  lVar40 = (long)((long)pcVar45 - local_1b8) >> 2;
LAB_002216e3:
                  psVar28 = (pointer)((long)&local_1d0.
                                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-3].
                                             super_pair<const_char_*,_const_char_*>.first + lVar32);
                }
                else {
                  pcVar45 = ((local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_pair<const_char_*,_const_char_*>).first;
                  lVar40 = (long)((long)pcVar45 - local_1b8) >> 2;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (lVar32 == 0x48) goto LAB_002216e3;
                }
                bVar15 = psVar28->matched;
                pcVar6 = (psVar28->super_pair<const_char_*,_const_char_*>).second;
                std::__cxx11::
                regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::
                operator++((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                            *)local_118);
                lVar32 = (long)pcVar6 - (long)pcVar45 >> 2;
                if (bVar15 == false) {
                  lVar32 = 0;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1d0.
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                lVar32 = lVar32 + lVar40;
                bVar15 = std::__cxx11::
                         regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                         ::operator==((regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                       *)local_118,
                                      (regex_iterator<const_wchar_t_*,_wchar_t,_std::__cxx11::regex_traits<wchar_t>_>
                                       *)local_278);
                pbVar43 = local_1d8;
              }
              psVar28 = (pointer)(uVar5 - lVar32);
              if (psVar28 != (pointer)0x0 && lVar32 <= (long)uVar5) {
                local_1d0.
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = psVar28;
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)psVar28;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (local_258 != (pointer)0x0) {
                operator_delete(local_258,(long)local_248 - (long)local_258);
              }
              if ((void *)auStack_100._8_8_ != (void *)0x0) {
                operator_delete((void *)auStack_100._8_8_,
                                local_f0.first._M_string_length - auStack_100._8_8_);
              }
              lVar21 = lVar21 + uVar5;
              pwVar24 = pwVar24 + 2;
            } while (pwVar24 != local_188);
          }
          std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                    ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)&local_218);
          puVar9 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((wchar_t *)puVar8 != (wchar_t *)0x0) {
            operator_delete(puVar8,(long)puVar9 - (long)puVar8);
            if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_238.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_238.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_238.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          pwVar24 = local_1b0;
          if ((pointer *)
              local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer *)
              ((long)&local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 0x10U)) {
            operator_delete(local_178.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_178.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage * 4 + 4);
          }
          pwVar11 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar12 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar7 = local_40;
          pwVar13 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar42 = local_1a8.field_2._M_allocated_capacity * 4 + 4;
            _Var37._M_p = local_1a8._M_dataplus._M_p;
LAB_00221ed4:
            operator_delete(_Var37._M_p,uVar42);
            pwVar11 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            puVar12 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar7 = local_40;
            pwVar13 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else {
          lVar21 = std::__cxx11::string::find((char *)pbVar43,*(ulong *)(p_Var22 + 1),0);
          if (lVar21 == -1) goto code_r0x00221409;
          unicode_cpts_from_utf8(&local_178,pbVar43);
          if ((long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            lVar21 = (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2;
            lVar32 = 0;
            do {
              if (0x7f < local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar32]) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this,
                           "Regex includes both unicode categories and non-ASCII characters - not supported"
                          );
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              lVar32 = lVar32 + 1;
            } while (lVar21 + (ulong)(lVar21 == 0) != lVar32);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          local_1a8._M_string_length = 0;
          local_1a8.field_2._M_allocated_capacity =
               local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          uVar42 = pbVar43->_M_string_length;
          if (uVar42 != 0) {
            uVar36 = 0;
            bVar15 = false;
            do {
              pcVar4 = (pbVar43->_M_dataplus)._M_p;
              cVar2 = pcVar4[uVar36];
              if (cVar2 == '[') {
                if ((uVar36 != 0) && (pcVar4[uVar36 - 1] == '\\')) goto LAB_00221ae7;
                bVar15 = true;
                std::__cxx11::string::push_back((char)&local_1a8);
              }
              else {
                if ((bool)~bVar15 || cVar2 != ']') {
                  if ((((cVar2 == '\\') && (uVar29 = uVar36 + 4, uVar29 < uVar42)) &&
                      (pcVar4[uVar36 + 1] == 'p')) &&
                     ((pcVar4[uVar36 + 2] == '{' && (pcVar4[uVar29] == '}')))) {
                    std::__cxx11::string::substr((ulong)local_118,(ulong)pbVar43);
                    cVar25 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             ::find(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                     ::k_ucat_enum_abi_cxx11_._M_t,(key_type *)local_118);
                    if ((_Rb_tree_header *)cVar25._M_node !=
                        &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                      if (!bVar15) {
                        std::__cxx11::string::push_back((char)&local_1a8);
                      }
                      pmVar26 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                      ::k_ucat_enum_abi_cxx11_,(key_type *)local_118);
                      std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                                (&unicode_regex_split::k_ucat_cpt,pmVar26);
                      std::__cxx11::string::push_back((char)&local_1a8);
                      pmVar26 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                      ::k_ucat_enum_abi_cxx11_,(key_type *)local_118);
                      pmVar27 = std::
                                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::at(&unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                      ::k_ucat_map_abi_cxx11_,pmVar26);
                      std::__cxx11::string::_M_append
                                ((char *)&local_1a8,(ulong)(pmVar27->_M_dataplus)._M_p);
                      uVar36 = uVar29;
                      if (!bVar15) {
                        std::__cxx11::string::push_back((char)&local_1a8);
                      }
                    }
                    if (local_118._0_8_ != (long)local_118 + 0x10) {
                      operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
                    }
                    if ((_Rb_tree_header *)cVar25._M_node !=
                        &unicode_regex_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::k_ucat_enum_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
                    goto LAB_00221af7;
                  }
                }
                else if (pcVar4[uVar36 - 1] != '\\') {
                  std::__cxx11::string::push_back((char)&local_1a8);
                  bVar15 = false;
                  goto LAB_00221af7;
                }
LAB_00221ae7:
                std::__cxx11::string::push_back((char)&local_1a8);
              }
LAB_00221af7:
              uVar36 = uVar36 + 1;
              uVar42 = pbVar43->_M_string_length;
            } while (uVar36 < uVar42);
          }
          std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
          basic_regex<std::char_traits<char>,std::allocator<char>>
                    ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,0x10);
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    (&local_238,
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_1f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3);
          local_188 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar21 = 0;
            pwVar24 = (wchar_t *)
                      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            do {
              uVar5 = *(unsigned_long *)pwVar24;
              std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
              regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                              *)local_118,(char *)(local_150 + lVar21),
                             (char *)(local_150 + lVar21 + uVar5),&local_218,0);
              local_248 = (pointer)0x0;
              pwStack_240 = (wchar_t *)0x0;
              local_258 = (pointer)0x0;
              psStack_250 = (pointer)0x0;
              local_278._16_4_ = 0;
              local_278._20_4_ = 0;
              local_278._24_4_ = 0;
              local_278._0_8_ = (wchar_t *)0x0;
              local_278._8_4_ = 0;
              local_278._12_4_ = 0;
              bVar15 = std::__cxx11::
                       regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                       operator==((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_118,
                                  (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                   *)local_278);
              lVar32 = 0;
              while (!bVar15) {
                std::
                vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ::vector(&local_1d0,
                         (vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          *)(auStack_100 + 8));
                local_1b8 = local_f0.first.field_2._M_allocated_capacity;
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  pcVar45 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-3].
                            super_pair<const_char_*,_const_char_*>.first;
                  lVar40 = (long)pcVar45 - local_f0.first.field_2._0_8_;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  pcVar45 = ((local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_pair<const_char_*,_const_char_*>).first;
                  lVar40 = (long)pcVar45 - local_f0.first.field_2._0_8_;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                if (lVar32 < lVar40) {
                  local_180 = (wchar_t *)
                              (pcVar45 + -(local_f0.first.field_2._M_allocated_capacity + lVar32));
                  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<long>
                              (&local_238,
                               (iterator)
                               local_238.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                    psVar28 = local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)local_180;
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                    psVar28 = local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  }
                }
                lVar32 = (long)psVar28 -
                         (long)local_1d0.
                               super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                psVar1 = (pointer)((long)local_1d0.
                                         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar32 + -0x48)
                ;
                psVar41 = local_1d0.
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == psVar28) {
                  psVar41 = psVar1;
                }
                if (lVar32 == 0x48) {
                  psVar41 = psVar1;
                }
                local_180 = (wchar_t *)
                            ((psVar41->super_pair<const_char_*,_const_char_*>).second +
                            -(long)(psVar41->super_pair<const_char_*,_const_char_*>).first);
                if (psVar41->matched == false) {
                  local_180 = (wchar_t *)0x0;
                }
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(long *)&local_180);
                  lVar32 = (long)local_1d0.
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1d0.
                                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)local_180;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == psVar28) {
                  pcVar45 = *(char **)((long)&local_1d0.
                                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[-3].
                                              super_pair<const_char_*,_const_char_*>.first + lVar32)
                  ;
                  lVar40 = (long)pcVar45 - local_1b8;
LAB_00221d2d:
                  psVar28 = (pointer)((long)&local_1d0.
                                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[-3].
                                             super_pair<const_char_*,_const_char_*>.first + lVar32);
                }
                else {
                  pcVar45 = ((local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_pair<const_char_*,_const_char_*>).first;
                  lVar40 = (long)pcVar45 - local_1b8;
                  psVar28 = local_1d0.
                            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (lVar32 == 0x48) goto LAB_00221d2d;
                }
                bVar15 = psVar28->matched;
                pcVar6 = (psVar28->super_pair<const_char_*,_const_char_*>).second;
                std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                ::operator++((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                              *)local_118);
                lVar32 = (long)pcVar6 - (long)pcVar45;
                if (bVar15 == false) {
                  lVar32 = 0;
                }
                if (local_1d0.
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_1d0.
                                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                lVar32 = lVar32 + lVar40;
                bVar15 = std::__cxx11::
                         regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
                         operator==((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                     *)local_118,
                                    (regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>
                                     *)local_278);
                pbVar43 = local_1d8;
              }
              psVar28 = (pointer)(uVar5 - lVar32);
              if (psVar28 != (pointer)0x0 && lVar32 <= (long)uVar5) {
                local_1d0.
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = psVar28;
                if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_238,
                             (iterator)
                             local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_1d0);
                }
                else {
                  *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)psVar28;
                  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (local_258 != (pointer)0x0) {
                operator_delete(local_258,(long)local_248 - (long)local_258);
              }
              if ((void *)auStack_100._8_8_ != (void *)0x0) {
                operator_delete((void *)auStack_100._8_8_,
                                local_f0.first._M_string_length - auStack_100._8_8_);
              }
              lVar21 = lVar21 + uVar5;
              pwVar24 = pwVar24 + 2;
            } while (pwVar24 != local_188);
          }
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_218);
          puVar9 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((wchar_t *)puVar8 != (wchar_t *)0x0) {
            operator_delete(puVar8,(long)puVar9 - (long)puVar8);
            if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_238.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_238.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_238.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          pwVar24 = local_1b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          pwVar11 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar12 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          puVar7 = local_40;
          pwVar13 = (wchar_t *)
                    local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)0x0) {
            uVar42 = (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                     (long)local_178.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            _Var37._M_p = (pointer)local_178.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
            goto LAB_00221ed4;
          }
        }
      }
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pwVar13;
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar12;
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pwVar11;
      if (pwVar24 != (wchar_t *)0x0) {
        operator_delete(pwVar24,(long)puVar7 - (long)pwVar24);
      }
      pbVar43 = pbVar43 + 1;
    } while (pbVar43 != local_38);
  }
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a8,
            (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar8 = local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar42 = 0;
    pwVar24 = (wchar_t *)
              local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_1a8);
      uVar29 = *(unsigned_long *)pwVar24 + uVar42;
      uVar36 = uVar42;
      if (uVar42 < uVar29) {
        do {
          unicode_cpt_to_utf8_abi_cxx11_
                    ((string *)local_118,
                     local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar36]);
          std::__cxx11::string::_M_append
                    ((char *)(local_1a8._M_string_length + -0x20),local_118._0_8_);
          if (local_118._0_8_ != (long)local_118 + 0x10) {
            operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
          }
          uVar36 = uVar36 + 1;
          uVar29 = *(unsigned_long *)pwVar24 + uVar42;
        } while (uVar36 < uVar29);
      }
      pwVar24 = pwVar24 + 2;
      uVar42 = uVar29;
    } while (pwVar24 != (wchar_t *)puVar8);
  }
  *(undefined8 *)local_158 = 0;
  *(pointer *)(local_158 + 8) = (pointer)0x0;
  *(pointer *)(local_158 + 0x10) = (pointer)0x0;
  local_1d8 = (pointer)local_1a8._M_string_length;
  if (local_1a8._M_dataplus._M_p != (pointer)local_1a8._M_string_length) {
    _Var37._M_p = local_1a8._M_dataplus._M_p;
    do {
      local_118._0_8_ = (long)local_118 + 0x10;
      pwVar24 = (wchar_t *)(local_278 + 0x10);
      local_118._8_8_ = (pointer)0x0;
      local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
      unicode_cpts_from_utf8
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1d0,
                 (string *)_Var37._M_p);
      if (local_1d0.
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_1d0.
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar42 = 0;
        do {
          unicode_cpt_to_utf8_abi_cxx11_
                    ((string *)local_278,
                     *(uint32_t *)
                      ((long)&((local_1d0.
                                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_pair<const_char_*,_const_char_*>).first + uVar42 * 4));
          std::__cxx11::string::_M_append(local_118,local_278._0_8_);
          if ((wchar_t *)local_278._0_8_ != pwVar24) {
            operator_delete((void *)local_278._0_8_,CONCAT44(local_278._20_4_,local_278._16_4_) + 1)
            ;
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 < (ulong)((long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1d0.
                                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      uVar10 = local_118._8_8_;
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = local_278._16_4_ & 0xffffff00;
      local_278._0_8_ = pwVar24;
      if ((pointer)local_118._8_8_ != (pointer)0x0) {
        puVar39 = (pointer)0x0;
        do {
          unicode_byte_to_utf8_abi_cxx11_(in_stack_fffffffffffffd7f);
          std::__cxx11::string::_M_append((char *)local_278,local_218._0_8_);
          if (local_218._0_8_ != (long)&local_218 + 0x10U) {
            operator_delete((void *)local_218._0_8_,
                            (ulong)((long)&((local_218._M_automaton.
                                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->super__NFA_base)._M_paren_stack.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          puVar39 = (pointer)((long)puVar39 + 1);
        } while ((pointer)uVar10 != puVar39);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(local_158,(string *)local_278);
      if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
        operator_delete((void *)local_278._0_8_,CONCAT44(local_278._20_4_,local_278._16_4_) + 1);
      }
      if (local_1d0.
          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.
                        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d0.
                              super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118._0_8_ != (long)local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_,(ulong)(local_118._16_8_ + 1));
      }
      _Var37._M_p = _Var37._M_p + 0x20;
    } while ((pointer)_Var37._M_p != local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1a8);
  if ((wchar_t *)
      local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (wchar_t *)0x0) {
    operator_delete(local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  if (local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_158;
LAB_00221130:
  uVar29 = uVar29 + lVar21 + 1;
  uVar35 = uVar29;
  do {
    uVar34 = uVar35;
    if ((uVar29 < uVar42) || (uVar38 <= uVar34)) break;
    uVar17 = unicode_cpt_flags_from_cpt(*(uint32_t *)(local_118._0_8_ + uVar34 * 4));
    uVar35 = uVar34 + 1;
  } while (((ushort)uVar17 & 4) != 0);
  local_218._0_8_ = uVar34 - uVar36;
  uVar36 = uVar34;
  uVar29 = uVar34;
  if ((undefined1 *)local_218._0_8_ == (undefined1 *)0x0) goto joined_r0x00220f44;
  if ((unsigned_long *)local_278._8_8_ ==
      (unsigned_long *)CONCAT44(local_278._20_4_,local_278._16_4_)) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_278,
               (iterator)local_278._8_8_,(unsigned_long *)&local_218);
    goto joined_r0x00220f44;
  }
LAB_002212d4:
  *(undefined8 *)local_278._8_8_ = local_218._0_8_;
  local_278._8_8_ = local_278._8_8_ + 8;
  uVar36 = uVar34;
  uVar29 = uVar34;
  goto joined_r0x00220f44;
LAB_00221330:
  pwVar24 = local_188 + 2;
  uVar42 = uVar38;
  if (pwVar24 == local_1b0) goto LAB_0022134d;
  goto LAB_00220f2d;
LAB_00220ea8:
  pwVar24 = local_188 + 2;
  uVar42 = uVar38;
  if (pwVar24 == local_1b0) goto LAB_0022134d;
  goto LAB_002208f2;
code_r0x00221409:
  p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
  goto LAB_002213e1;
}

Assistant:

std::vector<std::string> unicode_regex_split(const std::string & text, const std::vector<std::string> & regex_exprs) {
    // unicode categories
    static const std::map<std::string, int> k_ucat_enum = {
        { "\\p{N}", unicode_cpt_flags::NUMBER },
        { "\\p{L}", unicode_cpt_flags::LETTER },
        { "\\p{P}", unicode_cpt_flags::PUNCTUATION },
        { "\\p{M}", unicode_cpt_flags::ACCENT_MARK },
        { "\\p{S}", unicode_cpt_flags::SYMBOL },
    };

    static const std::map<int, int> k_ucat_cpt = {
        { unicode_cpt_flags::NUMBER,      0xD1 },
        { unicode_cpt_flags::LETTER,      0xD2 },
        { unicode_cpt_flags::PUNCTUATION, 0xD3 },
        { unicode_cpt_flags::ACCENT_MARK, 0xD4 },
        { unicode_cpt_flags::SYMBOL,      0xD5 },
    };

    static const std::map<int, std::string> k_ucat_map = {
        { unicode_cpt_flags::NUMBER,      "\x30-\x39" }, // 0-9
        { unicode_cpt_flags::LETTER,      "\x41-\x5A\x61-\x7A" }, // A-Za-z
        { unicode_cpt_flags::PUNCTUATION, "\x21-\x23\x25-\x2A\x2C-\x2F\x3A-\x3B\x3F-\x40\\\x5B-\\\x5D\x5F\\\x7B\\\x7D" }, // !-#%-*,-/:-;?-@\[-\]_\{\}
        { unicode_cpt_flags::ACCENT_MARK, "" }, // no sub-128 codepoints
        { unicode_cpt_flags::SYMBOL,      "\\\x24\\\x2B\x3C-\x3E\x5E\x60\\\x7C" }, // $+<=>^`|
    };

    // compute collapsed codepoints only if needed by at least one regex
    bool need_collapse = false;
    for (const auto & regex_expr : regex_exprs) {
        // search for unicode categories
        for (const auto & ucat : k_ucat_enum) {
            if (std::string::npos != regex_expr.find(ucat.first)) {
                need_collapse = true;
                break;
            }
        }
    }

    const auto cpts = unicode_cpts_from_utf8(text);

    // generate a "collapsed" representation of the text, where all codepoints are replaced by a single byte
    // ref: https://github.com/ggml-org/llama.cpp/pull/6920#issuecomment-2081479935
    std::string text_collapsed;
    if (need_collapse) {
        // collapse all unicode categories
        text_collapsed.resize(cpts.size());

        for (size_t i = 0; i < cpts.size(); ++i) {
            // keep single-byte codepoints as is
            if (cpts[i] < 128) {
                text_collapsed[i] = cpts[i];
                continue;
            }

            const auto flags = unicode_cpt_flags_from_cpt(cpts[i]);

            if (flags.is_whitespace) {
                //NOTE: C++ std::regex \s does not mach 0x85, Rust and Python regex does.
                //text_collapsed[i] = (char) 0x85;  // <Next Line> as whitespace fallback
                text_collapsed[i] = (char) 0x0B;    // <vertical tab> as whitespace fallback
            } else if (k_ucat_cpt.find(flags.category_flag()) != k_ucat_cpt.end()) {
                text_collapsed[i] = k_ucat_cpt.at(flags.category_flag());
            } else {
                text_collapsed[i] = (char) 0xD0; // fallback
            }
        }
    }

    std::vector<size_t> bpe_offsets = { cpts.size() };

    for (const auto & regex_expr : regex_exprs) {
        // first, see if we have an efficient custom regex implementation
        auto tmp = unicode_regex_split_custom(text, regex_expr, bpe_offsets);

        if (!tmp.empty()) {
            bpe_offsets = std::move(tmp);
            continue;
        }

        // fallback to general-purpose std::regex / std::wregex
        try {
            // if a unicode category is used in the regex, we use the collapsed text and replace the unicode category
            // with the corresponding collapsed representation
            bool use_collapsed = false;
            for (const auto & ucat : k_ucat_enum) {
                if (std::string::npos != regex_expr.find(ucat.first)) {
                    use_collapsed = true;
                    break;
                }
            }

            if (use_collapsed) {
                // sanity-check that the original regex does not contain any non-ASCII characters
                const auto cpts_regex = unicode_cpts_from_utf8(regex_expr);
                for (size_t i = 0; i < cpts_regex.size(); ++i) {
                    if (cpts_regex[i] >= 128) {
                        throw std::runtime_error("Regex includes both unicode categories and non-ASCII characters - not supported");
                    }
                }

                // generate a collapsed representation of the regex
                std::string regex_expr_collapsed;

                // track if we are inside [], because nested [] are not allowed
                bool inside = false;
                for (size_t i = 0; i < regex_expr.size(); ++i) {
                    if (regex_expr[i] == '[' && (i == 0 || regex_expr[i - 1] != '\\')) {
                        regex_expr_collapsed += '[';
                        inside = true;
                        continue;
                    }

                    if (inside && regex_expr[i] == ']' && regex_expr[i - 1] != '\\') {
                        regex_expr_collapsed += ']';
                        inside = false;
                        continue;
                    }

                    if (regex_expr[i + 0] == '\\' && i + 4 < regex_expr.size() &&
                        regex_expr[i + 1] == 'p' &&
                        regex_expr[i + 2] == '{' &&
                        regex_expr[i + 4] == '}') {
                        const std::string pat = regex_expr.substr(i, 5);
                        if (k_ucat_enum.find(pat) != k_ucat_enum.end()) {
                            if (!inside) {
                                regex_expr_collapsed += '[';
                            }
                            regex_expr_collapsed += k_ucat_cpt.at(k_ucat_enum.at(pat));
                            regex_expr_collapsed += k_ucat_map.at(k_ucat_enum.at(pat));
                            if (!inside) {
                                regex_expr_collapsed += ']';
                            }
                            i += 4;
                            continue;
                        }
                    }

                    regex_expr_collapsed += regex_expr[i];
                }

                //printf("text_collapsed: %s\n", text_collapsed.c_str());
                //printf("regex_expr_collapsed: %s\n", regex_expr_collapsed.c_str());
                bpe_offsets = unicode_regex_split_stl(text_collapsed, regex_expr_collapsed, bpe_offsets);
            } else {
                // no unicode category used, we can use std::wregex directly
                const std::wstring wregex_expr = unicode_wstring_from_utf8(regex_expr);

                // std::wregex \s does not mach non-ASCII whitespaces, using 0x0B as fallback
                std::wstring wtext(cpts.begin(), cpts.end());
                for (size_t i = 0; i < wtext.size(); ++i) {
                    if (wtext[i] > 0x7F && unicode_cpt_flags_from_cpt(wtext[i]).is_whitespace) {
                        wtext[i] = 0x0B;
                    }
                }

                //printf("text: %s\n", text.c_str());
                //printf("regex_expr: %s\n", regex_expr.c_str());
                bpe_offsets = unicode_regex_split_stl(wtext, wregex_expr, bpe_offsets);
            }
        } catch (std::regex_error & e) {
            fprintf(stderr, "Failed to process regex: '%s'\n", regex_expr.c_str());
            fprintf(stderr, "Regex error: %s\n", e.what());
            throw std::runtime_error("Failed to process regex");
        }
    }

    std::vector<std::string> bpe_words;
    bpe_words.reserve(bpe_offsets.size()); // reserve memory for the approximate size

    size_t start = 0;
    for (size_t & offset : bpe_offsets) {
        bpe_words.emplace_back();
        for (size_t i = start; i < start + offset; ++i) {
            bpe_words.back() += unicode_cpt_to_utf8(cpts[i]);
        }
        start += offset;
    }

    return unicode_byte_encoding_process(bpe_words);
}